

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addition.h
# Opt level: O0

void __thiscall Addition_PlusPlus_Test::TestBody(Addition_PlusPlus_Test *this)

{
  bool bVar1;
  char *pcVar2;
  BigNumber *pBVar3;
  AssertHelper local_240;
  Message local_238;
  string local_230;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_5;
  Message local_1f8;
  string local_1f0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_4;
  Message local_1b8;
  string local_1b0;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_3;
  Message local_178;
  BigNumber local_170;
  string local_148;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  Message local_110;
  string local_108;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0;
  BigNumber local_c8;
  string local_a0;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  BigNumber num_1;
  Addition_PlusPlus_Test *this_local;
  
  num_1._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"1234",&local_59);
  BigNumber::BigNumber((BigNumber *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  BigNumber::operator++(&local_c8,(BigNumber *)local_38,0);
  BigNumber::toString_abi_cxx11_(&local_a0,&local_c8);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_80,"\"1234\"","num_1++.toString()",(char (*) [5])"1234",
             &local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  BigNumber::~BigNumber(&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/addition.h"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  BigNumber::toString_abi_cxx11_(&local_108,(BigNumber *)local_38);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_e8,"\"1235\"","num_1.toString()",(char (*) [5])"1235",
             &local_108);
  std::__cxx11::string::~string((string *)&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/addition.h"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  BigNumber::operator++(&local_170,(BigNumber *)local_38,0);
  BigNumber::toString_abi_cxx11_(&local_148,&local_170);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_128,"\"1235\"","num_1++.toString()",(char (*) [5])"1235",
             &local_148);
  std::__cxx11::string::~string((string *)&local_148);
  BigNumber::~BigNumber(&local_170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/addition.h"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  pBVar3 = BigNumber::operator++((BigNumber *)local_38);
  BigNumber::toString_abi_cxx11_(&local_1b0,pBVar3);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_190,"\"1237\"","(++num_1).toString()",(char (*) [5])"1237",
             &local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/addition.h"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  pBVar3 = BigNumber::operator++((BigNumber *)local_38);
  BigNumber::toString_abi_cxx11_(&local_1f0,pBVar3);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_1d0,"\"1238\"","(++num_1).toString()",(char (*) [5])0x440709,
             &local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/addition.h"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  BigNumber::toString_abi_cxx11_(&local_230,(BigNumber *)local_38);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_210,"\"1238\"","num_1.toString()",(char (*) [5])0x440709,
             &local_230);
  std::__cxx11::string::~string((string *)&local_230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/addition.h"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  BigNumber::~BigNumber((BigNumber *)local_38);
  return;
}

Assistant:

TEST(Addition, PlusPlus)
{
    BigNumber num_1("1234");
    EXPECT_EQ("1234", num_1++.toString());
    EXPECT_EQ("1235", num_1.toString());
    EXPECT_EQ("1235", num_1++.toString());
    EXPECT_EQ("1237", (++num_1).toString());
    EXPECT_EQ("1238", (++num_1).toString());
    EXPECT_EQ("1238", num_1.toString());
}